

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O1

_Bool gen_iblock(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar3;
  void *__ptr_02;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  size_t sVar9;
  size_t prog_sz;
  size_t inter_sym_num;
  size_t work_sz;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  uVar8 = (ulong)(uint)K;
  if (n_ESIs < K) {
    fprintf(_stderr,"Error:  Insufficient number of Symbols.\n        K=%d, #ESIs=%d\n",uVar8,
            (ulong)(uint)n_ESIs);
LAB_001015c6:
    __ptr_02 = (void *)0x0;
    __ptr_01 = (void *)0x0;
    __ptr_00 = (void *)0x0;
    __ptr = (void *)0x0;
    bVar7 = 0;
  }
  else {
    uVar1 = RqInterGetMemSizes(uVar8,n_ESIs - K,&local_38,&local_48,&local_40);
    if (uVar1 != 0) {
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,0x49,"RqInterGetMemSizes(K, nExtra, &work_sz, &prog_sz, &inter_sym_num)",(ulong)uVar1
             );
      goto LAB_001015c6;
    }
    __ptr = malloc(local_38);
    __ptr_00 = malloc(local_48);
    uVar1 = RqInterInit(uVar8,n_ESIs - K,__ptr,local_38);
    if (uVar1 == 0) {
      if (0 < n_ESIs) {
        uVar8 = 0;
        do {
          uVar1 = RqInterAddIds(__ptr,ESIs[uVar8],1);
          if (uVar1 != 0) {
            fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                    ,0x4f,"RqInterAddIds(wrk, ESIs[i], 1)",(ulong)uVar1);
            iVar2 = 2;
            goto LAB_00101459;
          }
          uVar8 = uVar8 + 1;
        } while ((uint)n_ESIs != uVar8);
      }
      iVar2 = 7;
LAB_00101459:
      bVar7 = (byte)uVar8;
      if (iVar2 == 2) goto LAB_0010151e;
      if (iVar2 != 7) goto LAB_0010155c;
      uVar1 = RqInterCompile(__ptr,__ptr_00,local_48);
      if (uVar1 != 0) {
        pcVar6 = "RqInterCompile(wrk, prog, prog_sz)";
        uVar4 = 0x50;
        goto LAB_00101626;
      }
      lVar5 = (long)T;
      sVar9 = n_ESIs * lVar5;
      __ptr_01 = malloc(sVar9);
      sVar3 = fread(__ptr_01,1,sVar9,_stdin);
      if (sVar3 != sVar9) {
        gen_iblock_cold_1();
        __ptr_02 = (void *)0x0;
        goto LAB_00101521;
      }
      sVar3 = local_40 * lVar5;
      __ptr_02 = malloc(sVar3);
      uVar1 = RqInterExecute(__ptr_00,lVar5,__ptr_01,sVar9,__ptr_02,sVar3);
      if (uVar1 == 0) {
        sVar9 = fwrite(__ptr_02,1,sVar3,_stdout);
        bVar7 = 1;
        if (sVar9 != sVar3) {
          gen_iblock_cold_2();
          goto LAB_00101521;
        }
      }
      else {
        bVar7 = 0;
        fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                ,0x5e,"RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz)",(ulong)uVar1
               );
      }
    }
    else {
      pcVar6 = "RqInterInit(K, nExtra, wrk, work_sz)";
      uVar4 = 0x4d;
LAB_00101626:
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,uVar4,pcVar6,(ulong)uVar1);
LAB_0010151e:
      __ptr_02 = (void *)0x0;
      __ptr_01 = (void *)0x0;
LAB_00101521:
      bVar7 = 0;
    }
  }
  if (__ptr_02 != (void *)0x0) {
    free(__ptr_02);
  }
  if (__ptr_01 != (void *)0x0) {
    free(__ptr_01);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
LAB_0010155c:
  return (_Bool)(bVar7 & 1);
}

Assistant:

bool gen_iblock(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqInterWorkMem* wrk = NULL;
	RqInterProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	if (n_ESIs < K) {
		fprintf(stderr, "Error:  Insufficient number of Symbols.\n"
		                "        K=%d, #ESIs=%d\n", K, n_ESIs);
		goto xit;
	}

	int nExtra = n_ESIs - K;
	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K,
				nExtra,
				&work_sz,
				&prog_sz,
				&inter_sym_num), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqInterInit(K, nExtra, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqInterAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqInterCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)n_ESIs;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = inter_sym_num * T;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqInterExecute(prog, T, indata, indata_sz, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	/* Done */
	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}